

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux_joystick.c
# Opt level: O1

GLFWbool openJoystickDevice(char *path)

{
  int code;
  int iVar1;
  int *piVar2;
  char *pcVar3;
  ulong uVar4;
  bool bVar5;
  input_id id;
  char evBits [4];
  char absBits [8];
  char guid [33];
  char keyBits [96];
  char name [256];
  _GLFWjoystickLinux linjs;
  
  pcVar3 = _glfw.joysticks[0].linjs.path;
  uVar4 = 0;
  bVar5 = false;
  while ((*(int *)(pcVar3 + -0x7c) == 0 || (iVar1 = strcmp(pcVar3,path), iVar1 != 0))) {
    bVar5 = 0xe < uVar4;
    uVar4 = uVar4 + 1;
    pcVar3 = pcVar3 + 0x1fa0;
    if (uVar4 == 0x10) {
LAB_0017194f:
      memset(&linjs,0,0x1f24);
      linjs.fd = open(path,0x800);
      if (linjs.fd != -1) {
        keyBits[0x50] = '\0';
        keyBits[0x51] = '\0';
        keyBits[0x52] = '\0';
        keyBits[0x53] = '\0';
        keyBits[0x54] = '\0';
        keyBits[0x55] = '\0';
        keyBits[0x56] = '\0';
        keyBits[0x57] = '\0';
        keyBits[0x58] = '\0';
        keyBits[0x59] = '\0';
        keyBits[0x5a] = '\0';
        keyBits[0x5b] = '\0';
        keyBits[0x5c] = '\0';
        keyBits[0x5d] = '\0';
        keyBits[0x5e] = '\0';
        keyBits[0x5f] = '\0';
        keyBits[0x40] = '\0';
        keyBits[0x41] = '\0';
        keyBits[0x42] = '\0';
        keyBits[0x43] = '\0';
        keyBits[0x44] = '\0';
        keyBits[0x45] = '\0';
        keyBits[0x46] = '\0';
        keyBits[0x47] = '\0';
        keyBits[0x48] = '\0';
        keyBits[0x49] = '\0';
        keyBits[0x4a] = '\0';
        keyBits[0x4b] = '\0';
        keyBits[0x4c] = '\0';
        keyBits[0x4d] = '\0';
        keyBits[0x4e] = '\0';
        keyBits[0x4f] = '\0';
        keyBits[0x30] = '\0';
        keyBits[0x31] = '\0';
        keyBits[0x32] = '\0';
        keyBits[0x33] = '\0';
        keyBits[0x34] = '\0';
        keyBits[0x35] = '\0';
        keyBits[0x36] = '\0';
        keyBits[0x37] = '\0';
        keyBits[0x38] = '\0';
        keyBits[0x39] = '\0';
        keyBits[0x3a] = '\0';
        keyBits[0x3b] = '\0';
        keyBits[0x3c] = '\0';
        keyBits[0x3d] = '\0';
        keyBits[0x3e] = '\0';
        keyBits[0x3f] = '\0';
        keyBits[0x20] = '\0';
        keyBits[0x21] = '\0';
        keyBits[0x22] = '\0';
        keyBits[0x23] = '\0';
        keyBits[0x24] = '\0';
        keyBits[0x25] = '\0';
        keyBits[0x26] = '\0';
        keyBits[0x27] = '\0';
        keyBits[0x28] = '\0';
        keyBits[0x29] = '\0';
        keyBits[0x2a] = '\0';
        keyBits[0x2b] = '\0';
        keyBits[0x2c] = '\0';
        keyBits[0x2d] = '\0';
        keyBits[0x2e] = '\0';
        keyBits[0x2f] = '\0';
        keyBits[0x10] = '\0';
        keyBits[0x11] = '\0';
        keyBits[0x12] = '\0';
        keyBits[0x13] = '\0';
        keyBits[0x14] = '\0';
        keyBits[0x15] = '\0';
        keyBits[0x16] = '\0';
        keyBits[0x17] = '\0';
        keyBits[0x18] = '\0';
        keyBits[0x19] = '\0';
        keyBits[0x1a] = '\0';
        keyBits[0x1b] = '\0';
        keyBits[0x1c] = '\0';
        keyBits[0x1d] = '\0';
        keyBits[0x1e] = '\0';
        keyBits[0x1f] = '\0';
        keyBits[0] = '\0';
        keyBits[1] = '\0';
        keyBits[2] = '\0';
        keyBits[3] = '\0';
        keyBits[4] = '\0';
        keyBits[5] = '\0';
        keyBits[6] = '\0';
        keyBits[7] = '\0';
        keyBits[8] = '\0';
        keyBits[9] = '\0';
        keyBits[10] = '\0';
        keyBits[0xb] = '\0';
        keyBits[0xc] = '\0';
        keyBits[0xd] = '\0';
        keyBits[0xe] = '\0';
        keyBits[0xf] = '\0';
        absBits[0] = '\0';
        absBits[1] = '\0';
        absBits[2] = '\0';
        absBits[3] = '\0';
        absBits[4] = '\0';
        absBits[5] = '\0';
        absBits[6] = '\0';
        absBits[7] = '\0';
        iVar1 = ioctl(linjs.fd,0x80044520);
        if ((((iVar1 < 0) || (iVar1 = ioctl(linjs.fd,0x80604521,keyBits), iVar1 < 0)) ||
            (iVar1 = ioctl(linjs.fd,0x80084523,absBits), iVar1 < 0)) ||
           (iVar1 = ioctl(linjs.fd,0x80084502,&id), iVar1 < 0)) {
          piVar2 = __errno_location();
          pcVar3 = strerror(*piVar2);
          _glfwInputError(0x10008,"Linux: Failed to query input device: %s",pcVar3);
          close(linjs.fd);
        }
        else {
          close(linjs.fd);
        }
      }
      return 0;
    }
  }
  if (!bVar5) {
    return 0;
  }
  goto LAB_0017194f;
}

Assistant:

static GLFWbool openJoystickDevice(const char* path)
{
    for (int jid = 0;  jid <= GLFW_JOYSTICK_LAST;  jid++)
    {
        if (!_glfw.joysticks[jid].present)
            continue;
        if (strcmp(_glfw.joysticks[jid].linjs.path, path) == 0)
            return GLFW_FALSE;
    }

    _GLFWjoystickLinux linjs = {0};
    linjs.fd = open(path, O_RDONLY | O_NONBLOCK);
    if (linjs.fd == -1)
        return GLFW_FALSE;

    char evBits[(EV_CNT + 7) / 8] = {0};
    char keyBits[(KEY_CNT + 7) / 8] = {0};
    char absBits[(ABS_CNT + 7) / 8] = {0};
    struct input_id id;

    if (ioctl(linjs.fd, EVIOCGBIT(0, sizeof(evBits)), evBits) < 0 ||
        ioctl(linjs.fd, EVIOCGBIT(EV_KEY, sizeof(keyBits)), keyBits) < 0 ||
        ioctl(linjs.fd, EVIOCGBIT(EV_ABS, sizeof(absBits)), absBits) < 0 ||
        ioctl(linjs.fd, EVIOCGID, &id) < 0)
    {
        _glfwInputError(GLFW_PLATFORM_ERROR,
                        "Linux: Failed to query input device: %s",
                        strerror(errno));
        close(linjs.fd);
        return GLFW_FALSE;
    }

    // Ensure this device supports the events expected of a joystick
    if (!isBitSet(EV_KEY, evBits) || !isBitSet(EV_ABS, evBits))
    {
        close(linjs.fd);
        return GLFW_FALSE;
    }

    char name[256] = "";

    if (ioctl(linjs.fd, EVIOCGNAME(sizeof(name)), name) < 0)
        strncpy(name, "Unknown", sizeof(name));

    char guid[33] = "";

    // Generate a joystick GUID that matches the SDL 2.0.5+ one
    if (id.vendor && id.product && id.version)
    {
        sprintf(guid, "%02x%02x0000%02x%02x0000%02x%02x0000%02x%02x0000",
                id.bustype & 0xff, id.bustype >> 8,
                id.vendor & 0xff,  id.vendor >> 8,
                id.product & 0xff, id.product >> 8,
                id.version & 0xff, id.version >> 8);
    }
    else
    {
        sprintf(guid, "%02x%02x0000%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x00",
                id.bustype & 0xff, id.bustype >> 8,
                name[0], name[1], name[2], name[3],
                name[4], name[5], name[6], name[7],
                name[8], name[9], name[10]);
    }

    int axisCount = 0, buttonCount = 0, hatCount = 0;

    for (int code = BTN_MISC;  code < KEY_CNT;  code++)
    {
        if (!isBitSet(code, keyBits))
            continue;

        linjs.keyMap[code - BTN_MISC] = buttonCount;
        buttonCount++;
    }

    for (int code = 0;  code < ABS_CNT;  code++)
    {
        linjs.absMap[code] = -1;
        if (!isBitSet(code, absBits))
            continue;

        if (code >= ABS_HAT0X && code <= ABS_HAT3Y)
        {
            linjs.absMap[code] = hatCount;
            hatCount++;
            // Skip the Y axis
            code++;
        }
        else
        {
            if (ioctl(linjs.fd, EVIOCGABS(code), &linjs.absInfo[code]) < 0)
                continue;

            linjs.absMap[code] = axisCount;
            axisCount++;
        }
    }

    _GLFWjoystick* js =
        _glfwAllocJoystick(name, guid, axisCount, buttonCount, hatCount);
    if (!js)
    {
        close(linjs.fd);
        return GLFW_FALSE;
    }

    strncpy(linjs.path, path, sizeof(linjs.path) - 1);
    memcpy(&js->linjs, &linjs, sizeof(linjs));

    pollAbsState(js);

    _glfwInputJoystick(js, GLFW_CONNECTED);
    return GLFW_TRUE;
}